

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O3

ParameterError str2unummax(long *val,char *str,long max)

{
  ParameterError PVar1;
  
  PVar1 = getnum(val,str,10);
  if (PVar1 == PARAM_OK) {
    if (*val < 0) {
      PVar1 = PARAM_NEGATIVE_NUMERIC;
    }
    else {
      PVar1 = PARAM_NUMBER_TOO_LARGE;
      if (*val <= max) {
        PVar1 = PARAM_OK;
      }
    }
  }
  return PVar1;
}

Assistant:

ParameterError str2unummax(long *val, const char *str, long max)
{
  ParameterError result = str2unum(val, str);
  if(result != PARAM_OK)
    return result;
  if(*val > max)
    return PARAM_NUMBER_TOO_LARGE;

  return PARAM_OK;
}